

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_tables.c
# Opt level: O0

int scanner_block_cmp_fn(ScannerBlock *a,ScannerBlock *b,hash_fns_t *fns)

{
  ScanState **ppSVar1;
  ScanState **ppSVar2;
  ScanState **sb;
  ScanState **sa;
  intptr_t block_size;
  intptr_t i;
  hash_fns_t *fns_local;
  ScannerBlock *b_local;
  ScannerBlock *a_local;
  
  ppSVar1 = a->chars;
  ppSVar2 = b->chars;
  block_size = 0;
  do {
    if ((long)fns->data[0] <= block_size) {
      return 0;
    }
    if (ppSVar1[block_size] != ppSVar2[block_size]) {
      if ((ppSVar1[block_size] == (ScanState *)0x0) || (ppSVar2[block_size] == (ScanState *)0x0)) {
        return 1;
      }
      if (ppSVar1[block_size]->index != ppSVar2[block_size]->index) {
        return 1;
      }
    }
    block_size = block_size + 1;
  } while( true );
}

Assistant:

static int scanner_block_cmp_fn(ScannerBlock *a, ScannerBlock *b, hash_fns_t *fns) {
  intptr_t i, block_size = (intptr_t)fns->data[0];
  ScanState **sa = a->chars;
  ScanState **sb = b->chars;

  for (i = 0; i < block_size; i++) {
    if (sa[i] == sb[i]) continue;
    if (!sa[i] || !sb[i]) return 1;
    if (sa[i]->index != sb[i]->index) return 1;
  }
  return 0;
}